

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O0

int cram_dependent_data_series(cram_fd *fd,cram_block_compression_hdr *hdr,cram_slice *s)

{
  int iVar1;
  cram_codec *c_3;
  cram_map *m_1;
  int local_90;
  int j_3;
  int bnum2_3;
  int bnum1_3;
  cram_codec *c_2;
  int local_78;
  int j_2;
  int bnum2_2;
  int bnum1_2;
  cram_codec *c_1;
  cram_map *m;
  int local_58;
  int j_1;
  int bnum2_1;
  int bnum1_1;
  cram_codec *c;
  int j;
  int bnum2;
  int bnum1;
  uint32_t orig_ds;
  int i;
  int core_used;
  int *block_used;
  cram_slice *s_local;
  cram_block_compression_hdr *hdr_local;
  cram_fd *fd_local;
  
  orig_ds = 0;
  block_used = (int *)s;
  s_local = (cram_slice *)hdr;
  hdr_local = (cram_block_compression_hdr *)fd;
  if ((fd->required_fields == 0) || (fd->required_fields == 0x7fffffff)) {
    hdr->data_series = 0x7fffffff;
    for (bnum1 = 0; bnum1 < *(int *)(*(long *)block_used + 0x20); bnum1 = bnum1 + 1) {
      iVar1 = cram_uncompress_block(*(cram_block **)(*(long *)(block_used + 4) + (long)bnum1 * 8));
      if (iVar1 != 0) {
        return -1;
      }
    }
    fd_local._4_4_ = 0;
  }
  else {
    hdr->data_series = 0;
    if ((fd->required_fields & 1) != 0) {
      hdr->data_series = hdr->data_series | 0x8000;
    }
    if ((fd->required_fields & 2) != 0) {
      hdr->data_series = hdr->data_series | 1;
    }
    if ((fd->required_fields & 4) != 0) {
      hdr->data_series = hdr->data_series | 0x200001;
    }
    if ((fd->required_fields & 8) != 0) {
      hdr->data_series = hdr->data_series | 3;
    }
    if ((fd->required_fields & 0x10) != 0) {
      hdr->data_series = hdr->data_series | 0x2000;
    }
    if ((fd->required_fields & 0x20) != 0) {
      hdr->data_series = hdr->data_series | 0x3c00b1d;
    }
    if ((fd->required_fields & 0x40) != 0) {
      hdr->data_series = hdr->data_series | 0x310021;
    }
    if ((fd->required_fields & 0x80) != 0) {
      hdr->data_series = hdr->data_series | 0x120023;
    }
    if ((fd->required_fields & 0x100) != 0) {
      hdr->data_series = hdr->data_series | 0x3fc0b3f;
    }
    if ((fd->required_fields & 0x200) != 0) {
      hdr->data_series = hdr->data_series | 0x17c00fdf;
    }
    if ((fd->required_fields & 0x800) == 0) {
      fd->decode_md = 0;
    }
    if ((fd->required_fields & 0x400) != 0) {
      hdr->data_series = hdr->data_series | 0x17c00fdf;
    }
    if ((fd->required_fields & 0x800) != 0) {
      hdr->data_series = hdr->data_series | 0x40005000;
    }
    if ((fd->required_fields & 0x1000) != 0) {
      hdr->data_series = hdr->data_series | 0x1001;
    }
    iVar1 = cram_uncompress_block(*s->block);
    if (iVar1 == 0) {
      _i = calloc((long)(*(int *)(*(long *)block_used + 0x20) + 1),4);
      if (_i == (void *)0x0) {
        fd_local._4_4_ = -1;
      }
      else {
        do {
          if (((ulong)s_local[4].block & 0x400000) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x800000) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x1000000) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x80) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x800) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x2000000) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x400) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x10) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x40) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x4000000) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x10000000) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x104;
          }
          if (((ulong)s_local[4].block & 0x17c00fdf) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 8;
          }
          if (((ulong)s_local[4].block & 4) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x100;
          }
          if (((ulong)s_local[4].block & 0x100) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x200;
          }
          if (((ulong)s_local[4].block & 0x40000000) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x4000;
          }
          if (((ulong)s_local[4].block & 0x80000) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x100000;
          }
          if (((ulong)s_local[4].block & 0x2000) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 1;
          }
          if (((ulong)s_local[4].block & 0x400) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x200000;
          }
          if (((ulong)s_local[4].block & 0xf0020) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x100000;
          }
          if ((*(int *)&s_local->cigar == 0) && (((ulong)s_local[4].block & 0x8000) != 0)) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x100020;
          }
          if (((ulong)s_local[4].block & 0x140000c0) != 0) {
            *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x100009;
          }
          bnum2 = *(int *)&s_local[4].block;
          for (bnum1 = 0; (uint)bnum1 < 0x1c; bnum1 = bnum1 + 1) {
            _bnum2_1 = (cram_codec *)
                       s_local[2].pair[(long)cram_dependent_data_series::i_to_id[bnum1] + -0xb];
            if (((*(uint *)&s_local[4].block & 1 << ((byte)bnum1 & 0x1f)) != 0) &&
               (_bnum2_1 != (cram_codec *)0x0)) {
              j = cram_codec_to_id(_bnum2_1,(int *)((long)&c + 4));
              while( true ) {
                if (j != -2) {
                  if (j == -1) {
                    orig_ds = 1;
                  }
                  else {
                    for (c._0_4_ = 0; (int)c < *(int *)(*(long *)block_used + 0x20);
                        c._0_4_ = (int)c + 1) {
                      if ((*(int *)(*(long *)(*(long *)(block_used + 4) + (long)(int)c * 8) + 8) ==
                           4) && (*(int *)(*(long *)(*(long *)(block_used + 4) + (long)(int)c * 8) +
                                          0xc) == j)) {
                        *(undefined4 *)((long)_i + (long)(int)c * 4) = 1;
                        iVar1 = cram_uncompress_block
                                          (*(cram_block **)
                                            (*(long *)(block_used + 4) + (long)(int)c * 8));
                        if (iVar1 != 0) {
                          free(_i);
                          return -1;
                        }
                      }
                    }
                  }
                }
                if ((c._4_4_ == -2) || (j == c._4_4_)) break;
                j = c._4_4_;
              }
            }
          }
          if (((*(uint *)((long)hdr_local->tag_encoding_map + 0xa4) & 0x800) != 0) ||
             (((ulong)s_local[4].block & 0x40000000) != 0)) {
            for (bnum1 = 0; bnum1 < 0x20; bnum1 = bnum1 + 1) {
              c_1 = (cram_codec *)s_local[1].pair[(long)bnum1 + -0xb];
              while (c_1 != (cram_codec *)0x0) {
                _bnum2_2 = (cram_codec *)c_1->free;
                if (_bnum2_2 != (cram_codec *)0x0) {
                  j_1 = cram_codec_to_id(_bnum2_2,&local_58);
                  while( true ) {
                    if (j_1 != -2) {
                      if (j_1 == -1) {
                        orig_ds = 1;
                      }
                      else {
                        for (m._4_4_ = 0; m._4_4_ < *(int *)(*(long *)block_used + 0x20);
                            m._4_4_ = m._4_4_ + 1) {
                          if ((*(int *)(*(long *)(*(long *)(block_used + 4) + (long)m._4_4_ * 8) + 8
                                       ) == 4) &&
                             (*(int *)(*(long *)(*(long *)(block_used + 4) + (long)m._4_4_ * 8) +
                                      0xc) == j_1)) {
                            *(undefined4 *)((long)_i + (long)m._4_4_ * 4) = 1;
                            iVar1 = cram_uncompress_block
                                              (*(cram_block **)
                                                (*(long *)(block_used + 4) + (long)m._4_4_ * 8));
                            if (iVar1 != 0) {
                              free(_i);
                              return -1;
                            }
                          }
                        }
                      }
                    }
                    if ((local_58 == -2) || (j_1 == local_58)) break;
                    j_1 = local_58;
                  }
                  c_1 = (cram_codec *)c_1->decode;
                }
              }
            }
          }
          for (bnum1 = 0; (uint)bnum1 < 0x1c; bnum1 = bnum1 + 1) {
            _bnum2_3 = (cram_codec *)
                       s_local[2].pair[(long)cram_dependent_data_series::i_to_id[bnum1] + -0xb];
            if (_bnum2_3 != (cram_codec *)0x0) {
              j_2 = cram_codec_to_id(_bnum2_3,&local_78);
              while( true ) {
                if (j_2 != -2) {
                  if (j_2 == -1) {
                    if (orig_ds != 0) {
                      *(uint *)&s_local[4].block =
                           1 << ((byte)bnum1 & 0x1f) | *(uint *)&s_local[4].block;
                    }
                  }
                  else {
                    for (c_2._4_4_ = 0; c_2._4_4_ < *(int *)(*(long *)block_used + 0x20);
                        c_2._4_4_ = c_2._4_4_ + 1) {
                      if (((*(int *)(*(long *)(*(long *)(block_used + 4) + (long)c_2._4_4_ * 8) + 8)
                            == 4) &&
                          (*(int *)(*(long *)(*(long *)(block_used + 4) + (long)c_2._4_4_ * 8) + 0xc
                                   ) == j_2)) && (*(int *)((long)_i + (long)c_2._4_4_ * 4) != 0)) {
                        *(uint *)&s_local[4].block =
                             1 << ((byte)bnum1 & 0x1f) | *(uint *)&s_local[4].block;
                      }
                    }
                  }
                }
                if ((local_78 == -2) || (j_2 == local_78)) break;
                j_2 = local_78;
              }
            }
          }
          for (bnum1 = 0; bnum1 < 0x20; bnum1 = bnum1 + 1) {
            c_3 = (cram_codec *)s_local[1].pair[(long)bnum1 + -0xb];
            while (c_3 != (cram_codec *)0x0) {
              if ((cram_codec *)c_3->free != (cram_codec *)0x0) {
                j_3 = cram_codec_to_id((cram_codec *)c_3->free,&local_90);
                while( true ) {
                  if (j_3 != -2) {
                    if (j_3 == -1) {
                      *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x40000000;
                    }
                    else {
                      for (m_1._4_4_ = 0; m_1._4_4_ < *(int *)(*(long *)block_used + 0x20);
                          m_1._4_4_ = m_1._4_4_ + 1) {
                        if (((*(int *)(*(long *)(*(long *)(block_used + 4) + (long)m_1._4_4_ * 8) +
                                      8) != 0) &&
                            (*(int *)(*(long *)(*(long *)(block_used + 4) + (long)m_1._4_4_ * 8) +
                                     0xc) == j_3)) &&
                           (*(int *)((long)_i + (long)m_1._4_4_ * 4) != 0)) {
                          *(uint *)&s_local[4].block = *(uint *)&s_local[4].block | 0x40000000;
                        }
                      }
                    }
                  }
                  if ((local_90 == -2) || (j_3 == local_90)) break;
                  j_3 = local_90;
                }
                c_3 = (cram_codec *)c_3->decode;
              }
            }
          }
        } while (bnum2 != *(int *)&s_local[4].block);
        free(_i);
        fd_local._4_4_ = 0;
      }
    }
    else {
      fd_local._4_4_ = -1;
    }
  }
  return fd_local._4_4_;
}

Assistant:

int cram_dependent_data_series(cram_fd *fd,
			       cram_block_compression_hdr *hdr,
			       cram_slice *s) {
    int *block_used;
    int core_used = 0;
    int i;
    static int i_to_id[] = {
	DS_BF, DS_AP, DS_FP, DS_RL, DS_DL, DS_NF, DS_BA, DS_QS,
	DS_FC, DS_FN, DS_BS, DS_IN, DS_RG, DS_MQ, DS_TL, DS_RN,
	DS_NS, DS_NP, DS_TS, DS_MF, DS_CF, DS_RI, DS_RS, DS_PD,
	DS_HC, DS_SC, DS_BB, DS_QQ,
    };
    uint32_t orig_ds;

    /*
     * Set the data_series bit field based on fd->required_fields
     * contents.
     */
    if (fd->required_fields && fd->required_fields != INT_MAX) {
	hdr->data_series = 0;

	if (fd->required_fields & SAM_QNAME)
	    hdr->data_series |= CRAM_RN;

	if (fd->required_fields & SAM_FLAG)
	    hdr->data_series |= CRAM_BF;

	if (fd->required_fields & SAM_RNAME)
	    hdr->data_series |= CRAM_RI | CRAM_BF;

	if (fd->required_fields & SAM_POS)
	    hdr->data_series |= CRAM_AP | CRAM_BF;

	if (fd->required_fields & SAM_MAPQ)
	    hdr->data_series |= CRAM_MQ;

	if (fd->required_fields & SAM_CIGAR)
	    hdr->data_series |= CRAM_CIGAR;

	if (fd->required_fields & SAM_RNEXT)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_RI | CRAM_NS |CRAM_BF;

	if (fd->required_fields & SAM_PNEXT)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_AP | CRAM_NP | CRAM_BF;

	if (fd->required_fields & SAM_TLEN)
	    hdr->data_series |= CRAM_CF | CRAM_NF | CRAM_AP | CRAM_TS |
		CRAM_BF | CRAM_MF | CRAM_RI | CRAM_CIGAR;

	if (fd->required_fields & SAM_SEQ)
	    hdr->data_series |= CRAM_SEQ;

	if (!(fd->required_fields & SAM_AUX))
	    // No easy way to get MD/NM without other tags at present
	    fd->decode_md = 0;

	if (fd->required_fields & SAM_QUAL)
	    hdr->data_series |= CRAM_SEQ;

	if (fd->required_fields & SAM_AUX)
	    hdr->data_series |= CRAM_RG | CRAM_TL | CRAM_aux;

	if (fd->required_fields & SAM_RGAUX)
	    hdr->data_series |= CRAM_RG | CRAM_BF;

	// Always uncompress CORE block
	if (cram_uncompress_block(s->block[0]))
	    return -1;
    } else {
	hdr->data_series = CRAM_ALL;

	for (i = 0; i < s->hdr->num_blocks; i++) {
	    if (cram_uncompress_block(s->block[i]))
		return -1;
	}

	return 0;
    }

    block_used = calloc(s->hdr->num_blocks+1, sizeof(int));
    if (!block_used)
	return -1;

    do {
	/*
	 * Also set data_series based on code prerequisites. Eg if we need
	 * CRAM_QS then we also need to know CRAM_RL so we know how long it
	 * is, or if we need FC/FP then we also need FN (number of features).
	 *
	 * It's not reciprocal though. We may be needing to decode FN
	 * but have no need to decode FC, FP and cigar ops.
	 */
	if (hdr->data_series & CRAM_RS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_PD)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_HC)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_QS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_IN)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_SC)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BS)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_DL)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BA)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_BB)    hdr->data_series |= CRAM_FC|CRAM_FP;
	if (hdr->data_series & CRAM_QQ)    hdr->data_series |= CRAM_FC|CRAM_FP;

	// cram_decode_seq() needs seq[] array
	if (hdr->data_series & (CRAM_SEQ|CRAM_CIGAR)) hdr->data_series |= CRAM_RL;

	if (hdr->data_series & CRAM_FP)    hdr->data_series |= CRAM_FC;
	if (hdr->data_series & CRAM_FC)    hdr->data_series |= CRAM_FN;
	if (hdr->data_series & CRAM_aux)   hdr->data_series |= CRAM_TL;
	if (hdr->data_series & CRAM_MF)    hdr->data_series |= CRAM_CF;
	if (hdr->data_series & CRAM_MQ)    hdr->data_series |= CRAM_BF;
	if (hdr->data_series & CRAM_BS)    hdr->data_series |= CRAM_RI;
	if (hdr->data_series & (CRAM_MF |CRAM_NS |CRAM_NP |CRAM_TS |CRAM_NF))
	    hdr->data_series |= CRAM_CF;
	if (!hdr->read_names_included && hdr->data_series & CRAM_RN)
	    hdr->data_series |= CRAM_CF | CRAM_NF;
	if (hdr->data_series & (CRAM_BA | CRAM_QS | CRAM_BB | CRAM_QQ))
	    hdr->data_series |= CRAM_BF | CRAM_CF | CRAM_RL;

	orig_ds = hdr->data_series;

	// Find which blocks are in use.
	for (i = 0; i < sizeof(i_to_id)/sizeof(*i_to_id); i++) {
	    int bnum1, bnum2, j;
	    cram_codec *c = hdr->codecs[i_to_id[i]];

	    if (!(hdr->data_series & (1<<i)))
		continue;

	    if (!c)
		continue;

	    bnum1 = cram_codec_to_id(c, &bnum2);

	    for (;;) {
		switch (bnum1) {
		case -2:
		    break;

		case -1:
		    core_used = 1;
		    break;

		default:
		    for (j = 0; j < s->hdr->num_blocks; j++) {
			if (s->block[j]->content_type == EXTERNAL &&
			    s->block[j]->content_id == bnum1) {
			    block_used[j] = 1;
			    if (cram_uncompress_block(s->block[j])) {
				free(block_used);
				return -1;
			    }
			}
		    }
		    break;
		}

		if (bnum2 == -2 || bnum1 == bnum2)
		    break;

		bnum1 = bnum2; // 2nd pass
	    }
	}

	// Tags too
	if ((fd->required_fields & SAM_AUX) ||
	    (hdr->data_series & CRAM_aux)) {
	    for (i = 0; i < CRAM_MAP_HASH; i++) {
		int bnum1, bnum2, j;
		cram_map *m = hdr->tag_encoding_map[i];

		while (m) {
		    cram_codec *c = m->codec;
		    if (!c)
			continue;

		    bnum1 = cram_codec_to_id(c, &bnum2);

		    for (;;) {
			switch (bnum1) {
			case -2:
			    break;

			case -1:
			    core_used = 1;
			    break;

			default:
			    for (j = 0; j < s->hdr->num_blocks; j++) {
				if (s->block[j]->content_type == EXTERNAL &&
				    s->block[j]->content_id == bnum1) {
				    block_used[j] = 1;
				    if (cram_uncompress_block(s->block[j])) {
					free(block_used);
					return -1;
				    }
				}
			    }
			    break;
			}

			if (bnum2 == -2 || bnum1 == bnum2)
			    break;

			bnum1 = bnum2; // 2nd pass
		    }

		    m = m->next;
		}
	    }
	}

	// We now know which blocks are in used, so repeat and find
	// which other data series need to be added.
	for (i = 0; i < sizeof(i_to_id)/sizeof(*i_to_id); i++) {
	    int bnum1, bnum2, j;
	    cram_codec *c = hdr->codecs[i_to_id[i]];

	    if (!c)
		continue;

	    bnum1 = cram_codec_to_id(c, &bnum2);

	    for (;;) {
		switch (bnum1) {
		case -2:
		    break;

		case -1:
		    if (core_used) {
			//printf(" + data series %08x:\n", 1<<i);
			hdr->data_series |= 1<<i;
		    }
		    break;

		default:
		    for (j = 0; j < s->hdr->num_blocks; j++) {
			if (s->block[j]->content_type == EXTERNAL &&
			    s->block[j]->content_id == bnum1) {
			    if (block_used[j]) {
				//printf(" + data series %08x:\n", 1<<i);
				hdr->data_series |= 1<<i;
			    }
			}
		    }
		    break;
		}

		if (bnum2 == -2 || bnum1 == bnum2)
		    break;

		bnum1 = bnum2; // 2nd pass
	    }
	}

	// Tags too
	for (i = 0; i < CRAM_MAP_HASH; i++) {
	    int bnum1, bnum2, j;
	    cram_map *m = hdr->tag_encoding_map[i];

	    while (m) {
		cram_codec *c = m->codec;
		if (!c)
		    continue;

		bnum1 = cram_codec_to_id(c, &bnum2);
		
		for (;;) {
		    switch (bnum1) {
		    case -2:
			break;

		    case -1:
			//printf(" + data series %08x:\n", CRAM_aux);
			hdr->data_series |= CRAM_aux;
			break;

		    default:
			for (j = 0; j < s->hdr->num_blocks; j++) {
			    if (s->block[j]->content_type &&
				s->block[j]->content_id == bnum1) {
				if (block_used[j]) {
				    //printf(" + data series %08x:\n",
				    //       CRAM_aux);
				    hdr->data_series |= CRAM_aux;
				}
			    }
			}
			break;
		    }

		    if (bnum2 == -2 || bnum1 == bnum2)
			break;

		    bnum1 = bnum2; // 2nd pass
		}

		m = m->next;
	    }
	}
    } while (orig_ds != hdr->data_series);

    free(block_used);
    return 0;
}